

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreRenderTarget.h
# Opt level: O2

void __thiscall
irr::video::
COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::COpenGLCoreRenderTarget
          (COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
           *this,COpenGLDriver *driver)

{
  long lVar1;
  long lVar2;
  E_DRIVER_TYPE EVar3;
  int iVar4;
  undefined4 extraout_var;
  COpenGLCoreFeature *pCVar5;
  ulong uVar6;
  size_type __new_size;
  
  *(undefined ***)&this->field_0x98 = &PTR__IReferenceCounted_0027ba48;
  *(undefined8 *)&this->field_0xa0 = 0;
  *(undefined4 *)&this->field_0xa8 = 1;
  IRenderTarget::IRenderTarget(&this->super_IRenderTarget,&PTR_construction_vtable_24__00281ec8);
  (this->super_IRenderTarget)._vptr_IRenderTarget = (_func_int **)0x281e80;
  *(undefined8 *)&this->field_0x98 = 0x281eb0;
  *(undefined8 *)&(this->super_IRenderTarget).field_0x58 = 0;
  *(undefined8 *)&(this->super_IRenderTarget).field_0x60 = 0;
  *(undefined8 *)&(this->super_IRenderTarget).field_0x68 = 0;
  this->field_0x70 = 1;
  this->ColorAttachment = 0;
  this->MultipleRenderTarget = 0;
  this->AssignedDepth = false;
  this->AssignedStencil = false;
  this->RequestTextureUpdate = false;
  this->RequestDepthStencilUpdate = false;
  this->BufferID = 0;
  (this->Size).Width = 0;
  (this->Size).Height = 0;
  this->Driver = driver;
  EVar3 = (*(driver->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x54])(driver);
  (this->super_IRenderTarget).DriverType = EVar3;
  iVar4 = (*(this->Driver->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x3b])();
  this->Size = *(dimension2d<unsigned_int> *)CONCAT44(extraout_var,iVar4);
  pCVar5 = COpenGLExtensionHandler::getFeature
                     ((COpenGLExtensionHandler *)&(this->Driver->super_CNullDriver).field_0x498);
  this->ColorAttachment = (uint)pCVar5->ColorAttachment;
  pCVar5 = COpenGLExtensionHandler::getFeature
                     ((COpenGLExtensionHandler *)&(this->Driver->super_CNullDriver).field_0x498);
  this->MultipleRenderTarget = (uint)pCVar5->MultipleRenderTarget;
  if (this->ColorAttachment == 0) {
    __new_size = 0;
  }
  else {
    COpenGLExtensionHandler::irrGlGenFramebuffers
              ((COpenGLExtensionHandler *)&(this->Driver->super_CNullDriver).field_0x498,1,
               &this->BufferID);
    __new_size = (size_type)this->ColorAttachment;
  }
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &(this->super_IRenderTarget).field_0x58,__new_size);
  lVar1 = *(long *)&(this->super_IRenderTarget).field_0x58;
  lVar2 = *(long *)&(this->super_IRenderTarget).field_0x60;
  for (uVar6 = 0; uVar6 < ((ulong)(lVar2 - lVar1) >> 2 & 0xffffffff); uVar6 = uVar6 + 1) {
    *(undefined4 *)(lVar1 + uVar6 * 4) = 0;
  }
  return;
}

Assistant:

COpenGLCoreRenderTarget(TOpenGLDriver *driver) :
			AssignedDepth(false), AssignedStencil(false), RequestTextureUpdate(false), RequestDepthStencilUpdate(false),
			BufferID(0), ColorAttachment(0), MultipleRenderTarget(0), Driver(driver)
	{
#ifdef _DEBUG
		setDebugName("COpenGLCoreRenderTarget");
#endif

		DriverType = Driver->getDriverType();

		Size = Driver->getScreenSize();

		ColorAttachment = Driver->getFeature().ColorAttachment;
		MultipleRenderTarget = Driver->getFeature().MultipleRenderTarget;

		if (ColorAttachment > 0)
			Driver->irrGlGenFramebuffers(1, &BufferID);

		AssignedTextures.set_used(static_cast<u32>(ColorAttachment));

		for (u32 i = 0; i < AssignedTextures.size(); ++i)
			AssignedTextures[i] = GL_NONE;
	}